

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void check_call_loop_wrappage(Context *ctx,int regnum)

{
  int iVar1;
  RegisterList *pRVar2;
  RegisterList *reg;
  int current_usage;
  int regnum_local;
  Context *ctx_local;
  
  iVar1 = -1;
  if (0 < ctx->loops) {
    iVar1 = 1;
  }
  pRVar2 = reglist_find(&ctx->used_registers,REG_TYPE_LABEL,regnum);
  if (pRVar2 == (RegisterList *)0x0) {
    fail(ctx,"Invalid label for CALL");
  }
  else if (pRVar2->misc == 0) {
    pRVar2->misc = iVar1;
  }
  else if (pRVar2->misc != iVar1) {
    if (iVar1 == 1) {
      fail(ctx,"CALL to this label must be wrapped in LOOP/ENDLOOP");
    }
    else {
      fail(ctx,"CALL to this label must not be wrapped in LOOP/ENDLOOP");
    }
  }
  return;
}

Assistant:

static void check_call_loop_wrappage(Context *ctx, const int regnum)
{
    // msdn says subroutines inherit aL register if you're in a loop when
    //  you call, and further more _if you ever call this function in a loop,
    //  it must always be called in a loop_. So we'll just pass our loop
    //  variable as a function parameter in those cases.

    const int current_usage = (ctx->loops > 0) ? 1 : -1;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, regnum);

    if (reg == NULL)
        fail(ctx, "Invalid label for CALL");
    else if (reg->misc == 0)
        reg->misc = current_usage;
    else if (reg->misc != current_usage)
    {
        if (current_usage == 1)
            fail(ctx, "CALL to this label must be wrapped in LOOP/ENDLOOP");
        else
            fail(ctx, "CALL to this label must not be wrapped in LOOP/ENDLOOP");
    } // else if
}